

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O0

void __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::fillPriorityQueue(SimpleToMonotone *this)

{
  int *__last;
  qsizetype qVar1;
  SimpleToMonotone *in_RDI;
  long in_FS_OFFSET;
  CompareVertices cmp;
  int i;
  int *in_stack_ffffffffffffffa8;
  QDataBuffer<int> *this_00;
  QDataBuffer<int> *in_stack_ffffffffffffffb0;
  CompareVertices __comp;
  CompareVertices local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __comp.m_parent = in_RDI;
  QDataBuffer<int>::reset(&in_RDI->m_upperVertex);
  QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::size(&in_RDI->m_edges);
  QDataBuffer<int>::reserve(in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffa8);
  local_c = 0;
  while( true ) {
    __last = (int *)(long)local_c;
    qVar1 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::size(&in_RDI->m_edges)
    ;
    if (qVar1 <= (long)__last) break;
    QDataBuffer<int>::add(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_c = local_c + 1;
  }
  local_18.m_parent = (SimpleToMonotone *)&DAT_aaaaaaaaaaaaaaaa;
  CompareVertices::CompareVertices(&local_18,in_RDI);
  this_00 = &in_RDI->m_upperVertex;
  QDataBuffer<int>::data(this_00);
  QDataBuffer<int>::data(this_00);
  QDataBuffer<int>::size(this_00);
  std::sort<int*,QTriangulator<unsigned_int>::SimpleToMonotone::CompareVertices>
            ((int *)in_RDI,__last,__comp);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTriangulator<T>::SimpleToMonotone::fillPriorityQueue()
{
    m_upperVertex.reset();
    m_upperVertex.reserve(m_edges.size());
    for (int i = 0; i < m_edges.size(); ++i)
        m_upperVertex.add(i);
    CompareVertices cmp(this);
    std::sort(m_upperVertex.data(), m_upperVertex.data() + m_upperVertex.size(), cmp);
    //for (int i = 1; i < m_upperVertex.size(); ++i) {
    //    Q_ASSERT(!cmp(m_upperVertex.at(i), m_upperVertex.at(i - 1)));
    //}
}